

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_mono_asio_channel_select.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  char *pcVar1;
  double dVar2;
  int local_390;
  undefined4 local_38c;
  int i;
  int outputChannelSelectors [1];
  paTestData data;
  PaError err;
  PaStream *stream;
  PaAsioStreamInfo asioOutputInfo;
  PaStreamParameters outputParameters;
  
  printf("PortAudio Test: output MONO sine wave. SR = %d, BufSize = %d\n",0xac44,0x40);
  for (local_390 = 0; local_390 < 200; local_390 = local_390 + 1) {
    dVar2 = sin(((double)local_390 / 200.0) * 3.141592653589793 * 2.0);
    outputChannelSelectors[(long)local_390 + -1] = (int)(float)(dVar2 * 0.8);
  }
  data.sine[0xc6] = 0.0;
  data.sine[199] = (float)Pa_Initialize();
  if (data.sine[199] == 0.0) {
    asioOutputInfo.channelSelectors._0_4_ = Pa_GetDefaultOutputDevice();
    asioOutputInfo.channelSelectors._4_4_ = 1;
    Pa_GetDeviceInfo((PaDeviceIndex)asioOutputInfo.channelSelectors);
    asioOutputInfo.size._0_4_ = 3;
    asioOutputInfo.hostApiType = paDirectSound;
    asioOutputInfo._12_4_ = 0;
    asioOutputInfo.version = 1;
    local_38c = 1;
    asioOutputInfo.flags = (unsigned_long)&local_38c;
    data.sine[199] =
         (float)Pa_OpenStream((PaStream **)&data.phase,(PaStreamParameters *)0x0,
                              (PaStreamParameters *)&asioOutputInfo.channelSelectors,44100.0,0x40,1,
                              patestCallback,&i);
    if ((data.sine[199] == 0.0) &&
       (data.sine[199] = (float)Pa_StartStream(stack0xffffffffffffffa0), data.sine[199] == 0.0)) {
      printf("Play for %d seconds.\n",10);
      fflush(_stdout);
      Pa_Sleep(10000);
      data.sine[199] = (float)Pa_StopStream(stack0xffffffffffffffa0);
      if ((data.sine[199] == 0.0) &&
         (data.sine[199] = (float)Pa_CloseStream(stack0xffffffffffffffa0), data.sine[199] == 0.0)) {
        Pa_Terminate();
        printf("Test finished.\n");
        return (int)data.sine[199];
      }
    }
  }
  Pa_Terminate();
  fprintf(_stderr,"An error occured while using the portaudio stream\n");
  fprintf(_stderr,"Error number: %d\n",(ulong)(uint)data.sine[199]);
  __stream = _stderr;
  pcVar1 = Pa_GetErrorText((PaError)data.sine[199]);
  fprintf(__stream,"Error message: %s\n",pcVar1);
  return (int)data.sine[199];
}

Assistant:

int main(void)
{
    PaStreamParameters outputParameters;
    PaAsioStreamInfo asioOutputInfo;
    PaStream *stream;
    PaError err;
    paTestData data;
    int outputChannelSelectors[1];
    int i;
    printf("PortAudio Test: output MONO sine wave. SR = %d, BufSize = %d\n", SAMPLE_RATE, FRAMES_PER_BUFFER);
    /* initialise sinusoidal wavetable */
    for( i=0; i<TABLE_SIZE; i++ )
    {
        data.sine[i] = (float) (AMPLITUDE * sin( ((double)i/(double)TABLE_SIZE) * M_PI * 2. ));
    }
    data.phase = 0;
    
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    outputParameters.device = OUTPUT_DEVICE;
    outputParameters.channelCount = 1;       /* MONO output */
    outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
    outputParameters.suggestedLatency = Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;

	/* Use an ASIO specific structure. WARNING - this is not portable. */
    asioOutputInfo.size = sizeof(PaAsioStreamInfo);
    asioOutputInfo.hostApiType = paASIO;
    asioOutputInfo.version = 1;
    asioOutputInfo.flags = paAsioUseChannelSelectors;
    outputChannelSelectors[0] = 1; /* skip channel 0 and use the second (right) ASIO device channel */
    asioOutputInfo.channelSelectors = outputChannelSelectors;
    outputParameters.hostApiSpecificStreamInfo = &asioOutputInfo;

    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              patestCallback,
              &data );
    if( err != paNoError ) goto error;

    err = Pa_StartStream( stream );
    if( err != paNoError ) goto error;
    
    printf("Play for %d seconds.\n", NUM_SECONDS ); fflush(stdout);
    Pa_Sleep( NUM_SECONDS * 1000 );

    err = Pa_StopStream( stream );
    if( err != paNoError ) goto error;
    
    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;
    
    Pa_Terminate();
    printf("Test finished.\n");
    return err;
error:
    Pa_Terminate();
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
    return err;
}